

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CS248::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  undefined4 *in_RSI;
  Spectrum SVar5;
  string color_string_4;
  XMLElement *e_quadratic_att_1;
  XMLElement *e_linear_att_1;
  XMLElement *e_constant_att_1;
  XMLElement *e_falloff_exp;
  XMLElement *e_falloff_deg;
  XMLElement *e_color_4;
  string color_string_3;
  XMLElement *e_quadratic_att;
  XMLElement *e_linear_att;
  XMLElement *e_constant_att;
  XMLElement *e_color_3;
  string color_string_2;
  XMLElement *e_color_2;
  string color_string_1;
  XMLElement *e_color_1;
  string color_string;
  XMLElement *e_color;
  string type;
  XMLElement *e_light;
  XMLElement *technique_cmu462;
  XMLElement *technique_common;
  XMLElement *technique;
  XMLElement *in_stack_fffffffffffff938;
  XMLNode *in_stack_fffffffffffff940;
  XMLElement *in_stack_fffffffffffff948;
  XMLElement *in_stack_fffffffffffff998;
  XMLElement *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffaf4;
  XMLElement *local_470;
  string *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  string local_458 [32];
  undefined8 local_438;
  float local_430;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  XMLElement *local_3e0;
  allocator local_3d1;
  string local_3d0 [32];
  XMLElement *local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  XMLElement *local_380;
  XMLElement *local_378;
  XMLElement *local_370;
  allocator local_361;
  string local_360 [32];
  XMLElement *local_340;
  undefined8 local_338;
  float local_330;
  string local_328 [32];
  undefined8 local_308;
  float local_300;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  XMLElement *local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  XMLElement *local_280;
  allocator local_271;
  string local_270 [32];
  XMLElement *local_250;
  allocator local_241;
  string local_240 [32];
  XMLElement *local_220;
  undefined8 local_218;
  float local_210;
  string local_208 [32];
  undefined8 local_1e8;
  float local_1e0;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  XMLElement *local_190;
  undefined8 local_188;
  float local_180;
  string local_178 [32];
  undefined8 local_158;
  float local_150;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  XMLElement *local_100;
  undefined8 local_f8;
  float local_f0;
  string local_e8 [32];
  undefined8 local_c8;
  float local_c0;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  XMLElement *local_70;
  allocator local_51;
  string local_50 [32];
  XMLElement *local_30;
  XMLElement *local_28;
  XMLElement *local_20;
  XMLElement *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar3 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,
                      (char *)in_stack_fffffffffffff938);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar3);
  pcVar3 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940,
                      (char *)in_stack_fffffffffffff938);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar3);
  *local_10 = 2;
  local_18 = (XMLElement *)0x0;
  local_20 = get_technique_common(in_stack_fffffffffffff998);
  local_28 = get_technique_cmu462(in_stack_fffffffffffff9d8);
  local_470 = local_28;
  if (local_28 == (XMLElement *)0x0) {
    local_470 = local_20;
  }
  local_18 = local_470;
  if (local_470 == (XMLElement *)0x0) {
    exit(1);
  }
  local_30 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
  if (local_30 != (XMLElement *)0x0) {
    pcVar3 = tinyxml2::XMLElement::Name((XMLElement *)0x1a3f9a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar3,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
    if (bVar2) {
      local_10[0x12] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"color",&local_91);
      pXVar4 = get_element((XMLElement *)
                           CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb98);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_70 = pXVar4;
      if (pXVar4 == (XMLElement *)0x0) {
        exit(1);
      }
      pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar3,&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::string(local_e8,local_b8);
      SVar5 = spectrum_from_string
                        ((string *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      local_f0 = SVar5.b;
      local_f8 = SVar5._0_8_;
      *(undefined8 *)(local_10 + 0x13) = local_f8;
      local_10[0x15] = local_f0;
      local_c8 = local_f8;
      local_c0 = local_f0;
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
      if (bVar2) {
        local_10[0x12] = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"color",&local_121);
        pXVar4 = get_element((XMLElement *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        local_100 = pXVar4;
        if (pXVar4 == (XMLElement *)0x0) {
          exit(1);
        }
        pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,pcVar3,&local_149);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        std::__cxx11::string::string(local_178,local_148);
        SVar5 = spectrum_from_string
                          ((string *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
        local_180 = SVar5.b;
        local_188 = SVar5._0_8_;
        *(undefined8 *)(local_10 + 0x13) = local_188;
        local_10[0x15] = local_180;
        local_158 = local_188;
        local_150 = local_180;
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_148);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
        uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffaf0);
        if (bVar2) {
          local_10[0x12] = 3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b0,"color",&local_1b1);
          pXVar4 = get_element((XMLElement *)
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                               in_stack_fffffffffffffb98);
          std::__cxx11::string::~string(local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
          local_190 = pXVar4;
          if (pXVar4 == (XMLElement *)0x0) {
            exit(1);
          }
          pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d8,pcVar3,&local_1d9);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
          std::__cxx11::string::string(local_208,local_1d8);
          SVar5 = spectrum_from_string((string *)CONCAT44(in_stack_fffffffffffffaf4,uVar6));
          local_210 = SVar5.b;
          local_218 = SVar5._0_8_;
          *(undefined8 *)(local_10 + 0x13) = local_218;
          local_10[0x15] = local_210;
          local_1e8 = local_218;
          local_1e0 = local_210;
          std::__cxx11::string::~string(local_208);
          std::__cxx11::string::~string(local_1d8);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
          if (bVar2) {
            local_10[0x12] = 4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_240,"color",&local_241);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_240);
            std::allocator<char>::~allocator((allocator<char> *)&local_241);
            local_220 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"constant_attenuation",&local_271);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
            local_250 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2a0,"linear_attenuation",&local_2a1);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_2a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
            local_280 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2d0,"quadratic_attenuation",&local_2d1);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_2d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
            local_2b0 = pXVar4;
            if ((((local_220 == (XMLElement *)0x0) || (local_250 == (XMLElement *)0x0)) ||
                (local_280 == (XMLElement *)0x0)) || (pXVar4 == (XMLElement *)0x0)) {
              exit(1);
            }
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2f8,pcVar3,&local_2f9);
            std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
            std::__cxx11::string::string(local_328,local_2f8);
            SVar5 = spectrum_from_string((string *)CONCAT44(in_stack_fffffffffffffaf4,uVar6));
            local_330 = SVar5.b;
            local_338 = SVar5._0_8_;
            local_10[0x15] = local_330;
            *(undefined8 *)(local_10 + 0x13) = local_338;
            local_308 = local_338;
            local_300 = local_330;
            std::__cxx11::string::~string(local_328);
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            std::__cxx11::string::~string(local_2f8);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
            if (!bVar2) {
              exit(1);
            }
            local_10[0x12] = 5;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_360,"color",&local_361);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_360);
            std::allocator<char>::~allocator((allocator<char> *)&local_361);
            local_340 = pXVar4;
            local_370 = tinyxml2::XMLNode::FirstChildElement
                                  (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
            local_378 = tinyxml2::XMLNode::FirstChildElement
                                  (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3a0,"constant_attenuation",&local_3a1);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_3a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
            local_380 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3d0,"linear_attenuation",&local_3d1);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_3d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
            local_3b0 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_400,"quadratic_attenuation",&local_401);
            pXVar4 = get_element((XMLElement *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb98);
            std::__cxx11::string::~string(local_400);
            std::allocator<char>::~allocator((allocator<char> *)&local_401);
            local_3e0 = pXVar4;
            if ((((local_340 == (XMLElement *)0x0) || (local_370 == (XMLElement *)0x0)) ||
                ((local_378 == (XMLElement *)0x0 ||
                 ((local_380 == (XMLElement *)0x0 || (local_3b0 == (XMLElement *)0x0)))))) ||
               (pXVar4 == (XMLElement *)0x0)) {
              exit(1);
            }
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_428,pcVar3,&local_429);
            std::allocator<char>::~allocator((allocator<char> *)&local_429);
            std::__cxx11::string::string(local_458,local_428);
            SVar5 = spectrum_from_string((string *)CONCAT44(in_stack_fffffffffffffaf4,uVar6));
            local_430 = SVar5.b;
            local_438 = SVar5._0_8_;
            local_10[0x15] = local_430;
            *(undefined8 *)(local_10 + 0x13) = local_438;
            std::__cxx11::string::~string(local_458);
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff938);
            dVar1 = atof(pcVar3);
            local_10[0x2a] = (float)dVar1;
            std::__cxx11::string::~string(local_428);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void ColladaParser::parse_light(XMLElement* xml, LightInfo& light) {
  // name & id
  light.id = xml->Attribute("id");
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_cmu462 = get_technique_cmu462(xml);

  technique = technique_cmu462 ? technique_cmu462 : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {
    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp =
          e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp && e_constant_att &&
          e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id
                                << "is not supported");
      exit(EXIT_FAILURE);
    }
  }

  // print summary
  stat("  |- " << light);
}